

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O1

int __thiscall
xmrig::DaemonClient::connect(DaemonClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  int64_t iVar2;
  int __flags;
  Data DStack_a8;
  Data DStack_98;
  Data DStack_88;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  GStack_70;
  
  if ((this->super_BaseClient).m_state != ConnectingState) {
    (this->super_BaseClient).m_state = ConnectingState;
    iVar2 = getBlockTemplate(this);
    return (int)iVar2;
  }
  __flags = 0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&GStack_70,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400
                    ,(CrtAllocator *)0x0);
  DStack_a8.n = (Number)0x0;
  DStack_a8.s.str = (Ch *)0x3000000000000;
  String::toJSON((String *)&DStack_98.s);
  DStack_88.s.str = (Ch *)0x40500000018d642;
  DStack_88.n = (Number)0xe;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&DStack_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&DStack_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&DStack_98.s,GStack_70.allocator_);
  DStack_98.s.str = (Ch *)0x40500000018d651;
  DStack_98.n = (Number)0xc;
  DStack_88.n = (Number)0x8;
  DStack_88.s.str = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&DStack_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&DStack_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&DStack_88.s,GStack_70.allocator_);
  JsonRequest::create(&GStack_70,BaseClient::m_sequence,"getblocktemplate",(Value *)&DStack_a8.s);
  send(this,3,"/json_rpc",(size_t)&GStack_70,__flags);
  lVar1 = BaseClient::m_sequence;
  BaseClient::m_sequence = BaseClient::m_sequence + 1;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&GStack_70);
  return (int)lVar1;
}

Assistant:

void xmrig::DaemonClient::setState(SocketState state)
{
    assert(m_state != state);
    if (m_state == state) {
        return;
    }

    m_state = state;

    switch (state) {
    case ConnectedState:
        {
            m_failures = 0;
            m_listener->onLoginSuccess(this);

            const uint64_t interval = std::max<uint64_t>(20, m_pool.pollInterval());
            m_timer->start(interval, interval);
        }
        break;

    case UnconnectedState:
        m_failures = -1;
        m_timer->stop();
        break;

    default:
        break;
    }
}